

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_section_fixups.cpp
# Opt level: O1

void __thiscall
ExchangeExternalFixups_RoundTripForTwoFixups_Test::
~ExchangeExternalFixups_RoundTripForTwoFixups_Test
          (ExchangeExternalFixups_RoundTripForTwoFixups_Test *this)

{
  (this->super_ExchangeExternalFixups).super_Test._vptr_Test =
       (_func_int **)&PTR__ExchangeExternalFixups_002413e0;
  pstore::database::~database(&(this->super_ExchangeExternalFixups).import_db_);
  in_memory_store::~in_memory_store(&(this->super_ExchangeExternalFixups).import_store_);
  pstore::database::~database(&(this->super_ExchangeExternalFixups).export_db_);
  in_memory_store::~in_memory_store(&(this->super_ExchangeExternalFixups).export_store_);
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x290);
  return;
}

Assistant:

TEST_F (ExchangeExternalFixups, RoundTripForTwoFixups) {
    using namespace pstore::exchange;
    constexpr auto comments = false;

    constexpr auto name_index = pstore::trailer::indices::name;
    std::vector<pstore::gsl::czstring> strings{"foo", "bar"};

    // Add these strings to the database.
    std::unordered_map<std::string, string_address> indir_strings;
    add_export_strings<name_index> (export_db_, std::begin (strings), std::end (strings),
                                    std::inserter (indir_strings, std::end (indir_strings)));



    // Write the names that we just created as JSON.
    export_ns::string_mapping exported_names{export_db_, export_ns::name_index_tag ()};
    export_ns::ostringstream exported_names_stream;
    export_ns::emit_strings<name_index> (exported_names_stream, export_ns::indent{}, export_db_,
                                         export_db_.get_current_revision (), "", &exported_names,
                                         comments);



    // Build a collection of external fixups. These refer to names added to the database
    // add_export_strings().
    xfixup_collection xfixups;
    xfixups.emplace_back (indir_strings["foo"], static_cast<pstore::repo::relocation_type> (5),
                          pstore::repo::binding::strong, 7, 9);
    xfixups.emplace_back (indir_strings["bar"], static_cast<pstore::repo::relocation_type> (11),
                          pstore::repo::binding::weak, 13, 17);



    // Export the external fixup array to the 'exported_fixups' string-stream.
    export_ns::ostringstream exported_fixups;
    emit_external_fixups (exported_fixups, export_ns::indent{}, export_db_, exported_names,
                          std::begin (xfixups), std::end (xfixups), comments);



    // Create matching names in the imported database.
    mock_mutex mutex;
    auto transaction = begin (import_db_, std::unique_lock<mock_mutex>{mutex});

    import_ns::string_mapping imported_names;
    {
        using namespace import_ns;
        auto parser = pstore::json::make_parser (
            callbacks::make<array_rule<strings_array_members, decltype (&transaction),
                                       decltype (&imported_names)>> (&import_db_, &transaction,
                                                                     &imported_names));
        parser.input (exported_names_stream.str ()).eof ();
        ASSERT_FALSE (parser.has_error ())
            << "Expected the JSON parse to succeed (" << parser.last_error ().message () << ')';
    }


    {
        xfixup_collection imported_xfixups;
        imported_xfixups.reserve (2);

        auto parser = pstore::json::make_parser (import_ns::callbacks::make<xfixup_array_root> (
            &import_db_, &imported_names, &imported_xfixups));
        parser.input (exported_fixups.str ()).eof ();

        // Check the result.
        ASSERT_FALSE (parser.has_error ())
            << "Expected the JSON parse to succeed (" << parser.last_error ().message () << ')';

        compare_external_fixups (export_db_, xfixups, import_db_, imported_xfixups);
    }
    transaction.commit ();
}